

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectPivots(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *threshold)

{
  long lVar1;
  uint *puVar2;
  undefined8 *puVar3;
  int iVar4;
  int iVar5;
  pointer pnVar6;
  undefined8 uVar7;
  Pring *pPVar8;
  Pring *pPVar9;
  long lVar10;
  type_conflict5 tVar11;
  int iVar12;
  Pring *pPVar13;
  long lVar14;
  Pring *pPVar15;
  uint uVar16;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *extraout_RDX;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *extraout_RDX_00;
  long lVar17;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_00;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar18;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_01;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *extraout_RDX_01;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_02;
  ulong uVar19;
  long lVar20;
  long lVar21;
  int iVar22;
  uint uVar23;
  long lVar24;
  int iVar25;
  long lVar26;
  ulong uVar27;
  int local_3c8;
  int local_3c4;
  int local_3c0;
  cpp_dec_float<50U,_int,_void> local_3b8;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_378;
  int local_36c;
  ulong local_368;
  long local_360;
  type local_358;
  long local_320;
  cpp_dec_float<50U,_int,_void> local_318;
  int local_2e0;
  int local_2dc;
  int local_2d8;
  int local_2d4;
  long local_2d0;
  cpp_dec_float<50U,_int,_void> *local_2c8;
  long local_2c0;
  Pring *local_2b8;
  ulong local_2b0;
  multiprecision local_2a8 [8];
  uint auStack_2a0 [2];
  uint local_298 [2];
  uint auStack_290 [2];
  uint local_288 [2];
  int local_280;
  undefined1 local_27c;
  fpclass_type local_278;
  int32_t local_274;
  multiprecision local_268 [8];
  uint auStack_260 [2];
  uint local_258 [2];
  uint auStack_250 [2];
  uint local_248 [2];
  int local_240;
  undefined1 local_23c;
  fpclass_type local_238;
  int32_t iStack_234;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined4 local_200;
  undefined1 local_1fc;
  undefined8 local_1f8;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined4 local_1c0;
  undefined1 local_1bc;
  undefined8 local_1b8;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined4 local_180;
  undefined1 local_17c;
  undefined8 local_178;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined4 local_140;
  undefined1 local_13c;
  undefined8 local_138;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  int local_100;
  undefined1 local_fc;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined4 local_c0;
  undefined1 local_bc;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined4 local_80;
  undefined1 local_7c;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  int local_40;
  undefined1 local_3c;
  undefined8 local_38;
  
  local_3b8.fpclass = cpp_dec_float_finite;
  local_3b8.prec_elem = 10;
  local_3b8.data._M_elems[0] = 0;
  local_3b8.data._M_elems[1] = 0;
  local_3b8.data._M_elems[2] = 0;
  local_3b8.data._M_elems[3] = 0;
  local_3b8.data._M_elems[4] = 0;
  local_3b8.data._M_elems[5] = 0;
  local_3b8.data._M_elems._24_5_ = 0;
  local_3b8.data._M_elems[7]._1_3_ = 0;
  local_3b8.data._M_elems._32_5_ = 0;
  local_3b8.data._M_elems[9]._1_3_ = 0;
  local_3b8.exp = 0;
  local_3b8.neg = false;
  local_2c8 = &threshold->m_backend;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&local_318,0.0,(type *)0x0);
  local_2b0 = 0;
  iVar12 = ~(this->temp).stage + this->thedim;
  local_2e0 = 4;
  if (iVar12 < 4) {
    local_2e0 = iVar12;
  }
  local_2b8 = &(this->temp).pivots;
  uVar19 = 2;
  local_3c8 = -1;
  iVar12 = -1;
  local_3c0 = local_3c8;
  local_378 = this;
  do {
    do {
      pPVar13 = (this->temp).pivot_colNZ + (int)uVar19;
      for (pPVar15 = (this->temp).pivot_rowNZ + (int)uVar19; local_368 = uVar19,
          pPVar15 == pPVar15->next; pPVar15 = pPVar15 + 1) {
        if (pPVar13 != pPVar13->next) {
          local_3c8 = pPVar13->next->idx;
          local_320 = (long)local_3c8;
          lVar17 = (long)((this->u).col.start[local_320] + -1 + (this->u).col.len[local_320]);
          lVar21 = lVar17 - (this->temp).s_cact[local_320];
          iVar22 = this->thedim + 1;
          local_2dc = (int)uVar19 + 1;
          local_3c4 = -1;
          local_2d0 = lVar21;
          goto LAB_0021dcf4;
        }
        uVar19 = (ulong)((int)uVar19 + 1);
        pPVar13 = pPVar13 + 1;
      }
      iVar12 = pPVar15->next->idx;
      iVar4 = (this->u).row.start[iVar12];
      iVar22 = (this->u).row.len[iVar12];
      iVar25 = iVar22 + -1 + iVar4;
      pnVar6 = (this->temp).s_max.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar7 = *(undefined8 *)((long)pnVar6[iVar12].m_backend.data._M_elems + 0x20);
      local_3b8.data._M_elems._32_5_ = SUB85(uVar7,0);
      local_3b8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
      local_3b8.data._M_elems._0_8_ = *(undefined8 *)pnVar6[iVar12].m_backend.data._M_elems;
      local_3b8.data._M_elems._8_8_ =
           *(undefined8 *)((long)pnVar6[iVar12].m_backend.data._M_elems + 8);
      puVar2 = (uint *)((long)pnVar6[iVar12].m_backend.data._M_elems + 0x10);
      local_3b8.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      uVar7 = *(undefined8 *)(puVar2 + 2);
      local_3b8.data._M_elems._24_5_ = SUB85(uVar7,0);
      local_3b8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
      local_3b8.exp = pnVar6[iVar12].m_backend.exp;
      local_3b8.neg = pnVar6[iVar12].m_backend.neg;
      local_3b8.fpclass = pnVar6[iVar12].m_backend.fpclass;
      local_3b8.prec_elem = pnVar6[iVar12].m_backend.prec_elem;
      local_358.m_backend.data._M_elems[0] = 0;
      tVar11 = boost::multiprecision::operator<
                         ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_3b8,(int *)&local_358);
      if (tVar11) {
        pnVar6 = (this->u).row.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_48 = *(undefined8 *)((long)pnVar6[iVar25].m_backend.data._M_elems + 0x20);
        local_68 = *(undefined8 *)pnVar6[iVar25].m_backend.data._M_elems;
        uStack_60 = *(undefined8 *)((long)pnVar6[iVar25].m_backend.data._M_elems + 8);
        puVar2 = (uint *)((long)pnVar6[iVar25].m_backend.data._M_elems + 0x10);
        local_58 = *(undefined8 *)puVar2;
        uStack_50 = *(undefined8 *)(puVar2 + 2);
        local_40 = pnVar6[iVar25].m_backend.exp;
        local_3c = pnVar6[iVar25].m_backend.neg;
        local_38._0_4_ = pnVar6[iVar25].m_backend.fpclass;
        local_38._4_4_ = pnVar6[iVar25].m_backend.prec_elem;
        boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_358,(multiprecision *)&local_68,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)(ulong)CONCAT31((int3)((uint)local_40 >> 8),local_3c));
        local_3b8.data._M_elems._32_5_ = local_358.m_backend.data._M_elems._32_5_;
        local_3b8.data._M_elems[9]._1_3_ = local_358.m_backend.data._M_elems[9]._1_3_;
        local_3b8.data._M_elems[1] = local_358.m_backend.data._M_elems[1];
        local_3b8.data._M_elems[0] = local_358.m_backend.data._M_elems[0];
        local_3b8.data._M_elems[4] = local_358.m_backend.data._M_elems[4];
        local_3b8.data._M_elems[5] = local_358.m_backend.data._M_elems[5];
        local_3b8.data._M_elems._24_5_ = local_358.m_backend.data._M_elems._24_5_;
        local_3b8.data._M_elems[7]._1_3_ = local_358.m_backend.data._M_elems[7]._1_3_;
        local_3b8.data._M_elems[2] = local_358.m_backend.data._M_elems[2];
        local_3b8.data._M_elems[3] = local_358.m_backend.data._M_elems[3];
        local_3b8.exp = local_358.m_backend.exp;
        local_3b8.neg = local_358.m_backend.neg;
        local_3b8.fpclass = local_358.m_backend.fpclass;
        local_3b8.prec_elem = local_358.m_backend.prec_elem;
        lVar21 = (long)(iVar22 + iVar4 + -2);
        lVar17 = lVar21 * 0x38 + 0x30;
        pnVar18 = extraout_RDX;
        for (; iVar4 <= lVar21; lVar21 = lVar21 + -1) {
          pnVar6 = (local_378->u).row.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_88 = *(undefined8 *)((long)(pnVar6->m_backend).data._M_elems + lVar17 + -0x10);
          puVar3 = (undefined8 *)((long)(pnVar6->m_backend).data._M_elems + lVar17 + -0x30);
          local_a8 = *puVar3;
          uStack_a0 = puVar3[1];
          puVar3 = (undefined8 *)((long)(pnVar6->m_backend).data._M_elems + lVar17 + -0x20);
          local_98 = *puVar3;
          uStack_90 = puVar3[1];
          local_80 = *(undefined4 *)((long)(pnVar6->m_backend).data._M_elems + lVar17 + -8);
          local_7c = *(undefined1 *)((long)(pnVar6->m_backend).data._M_elems + lVar17 + -4);
          local_78 = *(undefined8 *)((long)(pnVar6->m_backend).data._M_elems + lVar17);
          boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&local_358,(multiprecision *)&local_a8,pnVar18);
          tVar11 = boost::multiprecision::operator<
                             ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_3b8,&local_358);
          pnVar18 = arg;
          if (tVar11) {
            pnVar6 = (local_378->u).row.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_c8 = *(undefined8 *)((long)(pnVar6->m_backend).data._M_elems + lVar17 + -0x10);
            puVar3 = (undefined8 *)((long)(pnVar6->m_backend).data._M_elems + lVar17 + -0x30);
            local_e8 = *puVar3;
            uStack_e0 = puVar3[1];
            puVar3 = (undefined8 *)((long)(pnVar6->m_backend).data._M_elems + lVar17 + -0x20);
            local_d8 = *puVar3;
            uStack_d0 = puVar3[1];
            local_c0 = *(undefined4 *)((long)(pnVar6->m_backend).data._M_elems + lVar17 + -8);
            local_bc = *(undefined1 *)((long)(pnVar6->m_backend).data._M_elems + lVar17 + -4);
            local_b8 = *(undefined8 *)((long)(pnVar6->m_backend).data._M_elems + lVar17);
            boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&local_358,(multiprecision *)&local_e8,arg);
            local_3b8.data._M_elems._32_5_ = local_358.m_backend.data._M_elems._32_5_;
            local_3b8.data._M_elems[9]._1_3_ = local_358.m_backend.data._M_elems[9]._1_3_;
            local_3b8.data._M_elems[1] = local_358.m_backend.data._M_elems[1];
            local_3b8.data._M_elems[0] = local_358.m_backend.data._M_elems[0];
            local_3b8.data._M_elems[4] = local_358.m_backend.data._M_elems[4];
            local_3b8.data._M_elems[5] = local_358.m_backend.data._M_elems[5];
            local_3b8.data._M_elems._24_5_ = local_358.m_backend.data._M_elems._24_5_;
            local_3b8.data._M_elems[7]._1_3_ = local_358.m_backend.data._M_elems[7]._1_3_;
            local_3b8.data._M_elems[2] = local_358.m_backend.data._M_elems[2];
            local_3b8.data._M_elems[3] = local_358.m_backend.data._M_elems[3];
            local_3b8.exp = local_358.m_backend.exp;
            local_3b8.neg = local_358.m_backend.neg;
            local_3b8.fpclass = local_358.m_backend.fpclass;
            local_3b8.prec_elem = local_358.m_backend.prec_elem;
            pnVar18 = extraout_RDX_00;
          }
          lVar17 = lVar17 + -0x38;
        }
        pnVar6 = (local_378->temp).s_max.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(ulong *)((long)pnVar6[iVar12].m_backend.data._M_elems + 0x20) =
             CONCAT35(local_3b8.data._M_elems[9]._1_3_,local_3b8.data._M_elems._32_5_);
        puVar2 = (uint *)((long)pnVar6[iVar12].m_backend.data._M_elems + 0x10);
        *(undefined8 *)puVar2 = local_3b8.data._M_elems._16_8_;
        *(ulong *)(puVar2 + 2) =
             CONCAT35(local_3b8.data._M_elems[7]._1_3_,local_3b8.data._M_elems._24_5_);
        *(undefined8 *)pnVar6[iVar12].m_backend.data._M_elems = local_3b8.data._M_elems._0_8_;
        *(undefined8 *)((long)pnVar6[iVar12].m_backend.data._M_elems + 8) =
             local_3b8.data._M_elems._8_8_;
        pnVar6[iVar12].m_backend.exp = local_3b8.exp;
        pnVar6[iVar12].m_backend.neg = local_3b8.neg;
        pnVar6[iVar12].m_backend.fpclass = local_3b8.fpclass;
        pnVar6[iVar12].m_backend.prec_elem = local_3b8.prec_elem;
        this = local_378;
      }
      uVar27 = (ulong)iVar25;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                (&local_3b8,local_2c8);
      iVar25 = this->thedim + 1;
      lVar17 = uVar27 * 0xe + 0xd;
      uVar19 = 0xffffffffffffffff;
      for (; local_3c4 = (int)uVar19, (long)iVar4 <= (long)uVar27; uVar27 = uVar27 - 1) {
        pnVar6 = (local_378->u).row.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar5 = (local_378->u).row.idx[uVar27];
        iVar22 = (local_378->temp).s_cact[iVar5];
        local_318.data._M_elems._32_8_ =
             *(undefined8 *)((long)(pnVar6->m_backend).data._M_elems + lVar17 * 4 + -0x14);
        puVar2 = (uint *)((long)(pnVar6->m_backend).data._M_elems + lVar17 * 4 + -0x34);
        local_318.data._M_elems._0_8_ = *(undefined8 *)puVar2;
        local_318.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
        puVar2 = (uint *)((long)(pnVar6->m_backend).data._M_elems + lVar17 * 4 + -0x24);
        local_318.data._M_elems._16_8_ = *(undefined8 *)puVar2;
        local_318.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
        local_318.exp = *(int *)((long)(pnVar6->m_backend).data._M_elems + lVar17 * 4 + -0xc);
        local_318.neg = *(bool *)((long)(pnVar6->m_backend).data._M_elems + lVar17 * 4 + -8);
        local_318.fpclass =
             *(fpclass_type *)((long)(pnVar6->m_backend).data._M_elems + lVar17 * 4 + -4);
        local_318.prec_elem = *(int32_t *)((long)(pnVar6->m_backend).data._M_elems + lVar17 * 4);
        if (iVar22 < iVar25) {
          local_360 = CONCAT44(local_360._4_4_,iVar5);
          uVar19 = uVar19 & 0xffffffff;
          local_36c = iVar25;
          local_320 = (long)iVar5;
          local_2a8 = (multiprecision  [8])local_318.data._M_elems._0_8_;
          auStack_2a0 = (uint  [2])local_318.data._M_elems._8_8_;
          local_298 = (uint  [2])local_318.data._M_elems._16_8_;
          auStack_290 = (uint  [2])local_318.data._M_elems._24_8_;
          local_288 = (uint  [2])local_318.data._M_elems._32_8_;
          local_280 = local_318.exp;
          local_27c = local_318.neg;
          local_278 = local_318.fpclass;
          local_274 = local_318.prec_elem;
          boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&local_358,local_2a8,
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)(ulong)local_318.fpclass);
          tVar11 = boost::multiprecision::operator>
                             (&local_358,
                              (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_3b8);
          iVar25 = local_36c;
          if (tVar11) {
            local_3c4 = (int)uVar27;
            if (iVar22 <= (int)local_368) {
              local_3c8 = (int)local_360;
              uVar19 = local_368;
              lVar26 = local_320;
              this = local_378;
              goto LAB_0021e572;
            }
            uVar19 = uVar27 & 0xffffffff;
            local_3c8 = (int)local_360;
            iVar25 = iVar22;
          }
        }
        lVar17 = lVar17 + -0xe;
      }
      uVar19 = local_368;
      lVar26 = (long)local_3c8;
      this = local_378;
      iVar22 = iVar25;
LAB_0021e572:
      pPVar13 = (this->temp).pivot_col;
      pPVar15 = pPVar13[lVar26].next;
      pPVar8 = pPVar13[lVar26].prev;
      pPVar15->prev = pPVar8;
      pPVar8->next = pPVar15;
      pPVar13[lVar26].next = pPVar13 + lVar26;
      pPVar13[lVar26].prev = pPVar13 + lVar26;
    } while (local_3c4 < 0);
    pPVar13 = (this->temp).pivot_row;
    pPVar13[iVar12].pos = local_3c4 - (this->u).row.start[iVar12];
    iVar22 = ((int)uVar19 + -1) * (iVar22 + -1);
    pPVar13[iVar12].mkwtz = iVar22;
    pPVar15 = local_2b8;
    do {
      pPVar15 = pPVar15->next;
      if ((pPVar15->idx < 0) || (pPVar15->idx == iVar12)) break;
    } while (pPVar15->mkwtz < iVar22);
    pPVar15 = pPVar15->prev;
    if (pPVar15->idx != iVar12) {
      pPVar8 = pPVar13[iVar12].next;
      pPVar9 = pPVar13[iVar12].prev;
      pPVar8->prev = pPVar9;
      pPVar9->next = pPVar8;
      pPVar8 = pPVar15->next;
      pPVar13[iVar12].next = pPVar8;
      pPVar8->prev = pPVar13 + iVar12;
      pPVar13[iVar12].prev = pPVar15;
      pPVar15->next = pPVar13 + iVar12;
    }
    uVar23 = (int)local_2b0 + 1;
    local_2b0 = (ulong)uVar23;
    if (local_2e0 <= (int)uVar23) {
      return;
    }
  } while( true );
LAB_0021dcf4:
  lVar26 = local_320;
  if (lVar17 <= lVar21) goto LAB_0021e572;
  iVar4 = (this->u).col.idx[lVar17];
  lVar26 = (long)iVar4;
  iVar25 = (this->u).row.len[lVar26];
  if (iVar25 < iVar22) {
    local_2c0 = lVar26 * 0x38;
    local_358.m_backend.data._M_elems[0] = 0;
    local_36c = iVar22;
    local_360 = lVar17;
    local_2d8 = iVar25;
    local_2d4 = iVar4;
    tVar11 = boost::multiprecision::operator>
                       ((this->temp).s_max.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar26,(int *)&local_358);
    iVar22 = (this->u).row.start[lVar26];
    lVar17 = (long)iVar22;
    if (tVar11) {
      lVar26 = (long)((this->u).row.len[lVar26] + iVar22);
      lVar21 = lVar26 * 0xe + 0xc;
      do {
        lVar14 = lVar21;
        if (lVar26 <= lVar17) goto LAB_0021ddf8;
        lVar20 = lVar26 + -1;
        lVar24 = lVar26 + -1;
        lVar21 = lVar14 + -0xe;
        lVar26 = lVar20;
      } while ((this->u).row.idx[lVar24] != local_3c8);
      pnVar6 = (this->u).row.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_318.data._M_elems._32_8_ =
           *(undefined8 *)((long)(&pnVar6[-2].m_backend.data + 1) + lVar14 * 4);
      puVar2 = (uint *)((long)pnVar6[-2].m_backend.data._M_elems + lVar14 * 4 + 8);
      local_318.data._M_elems._0_8_ = *(undefined8 *)puVar2;
      local_318.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
      puVar2 = (uint *)((long)pnVar6[-2].m_backend.data._M_elems + lVar14 * 4 + 0x18);
      local_318.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      local_318.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
      local_318.exp = *(int *)((long)(&pnVar6[-2].m_backend.data + 1) + 8U + lVar14 * 4);
      local_318.neg = *(bool *)((long)(&pnVar6[-2].m_backend.data + 1) + 0xcU + lVar14 * 4);
      local_318._48_8_ = *(undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar14 * 4);
      local_3c0 = (int)lVar20;
LAB_0021ddf8:
      pnVar6 = (this->temp).s_max.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar7 = *(undefined8 *)((long)(pnVar6->m_backend).data._M_elems + local_2c0 + 0x20);
      local_3b8.data._M_elems._32_5_ = SUB85(uVar7,0);
      local_3b8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
      puVar2 = (uint *)((long)(pnVar6->m_backend).data._M_elems + local_2c0);
      local_3b8.data._M_elems._0_8_ = *(undefined8 *)puVar2;
      local_3b8.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
      puVar2 = (uint *)((long)(pnVar6->m_backend).data._M_elems + local_2c0 + 0x10);
      local_3b8.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      uVar7 = *(undefined8 *)(puVar2 + 2);
      local_3b8.data._M_elems._24_5_ = SUB85(uVar7,0);
      local_3b8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
      local_3b8.exp = *(int *)((long)(&(pnVar6->m_backend).data + 1) + local_2c0);
      local_3b8.neg = *(bool *)((long)(&(pnVar6->m_backend).data + 1) + 4U + local_2c0);
      local_3b8._48_8_ = *(undefined8 *)((long)(&(pnVar6->m_backend).data + 1) + 8U + local_2c0);
    }
    else {
      pnVar6 = (this->u).row.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_108 = *(undefined8 *)((long)pnVar6[lVar17].m_backend.data._M_elems + 0x20);
      local_128 = *(undefined8 *)pnVar6[lVar17].m_backend.data._M_elems;
      uStack_120 = *(undefined8 *)((long)pnVar6[lVar17].m_backend.data._M_elems + 8);
      puVar2 = (uint *)((long)pnVar6[lVar17].m_backend.data._M_elems + 0x10);
      local_118 = *(undefined8 *)puVar2;
      uStack_110 = *(undefined8 *)(puVar2 + 2);
      local_100 = pnVar6[lVar17].m_backend.exp;
      local_fc = pnVar6[lVar17].m_backend.neg;
      local_f8._0_4_ = pnVar6[lVar17].m_backend.fpclass;
      local_f8._4_4_ = pnVar6[lVar17].m_backend.prec_elem;
      boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_358,(multiprecision *)&local_128,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)(ulong)CONCAT31((int3)((uint)local_100 >> 8),local_fc));
      local_3b8.data._M_elems._32_5_ = local_358.m_backend.data._M_elems._32_5_;
      local_3b8.data._M_elems[9]._1_3_ = local_358.m_backend.data._M_elems[9]._1_3_;
      local_3b8.data._M_elems[1] = local_358.m_backend.data._M_elems[1];
      local_3b8.data._M_elems[0] = local_358.m_backend.data._M_elems[0];
      local_3b8.data._M_elems[4] = local_358.m_backend.data._M_elems[4];
      local_3b8.data._M_elems[5] = local_358.m_backend.data._M_elems[5];
      local_3b8.data._M_elems._24_5_ = local_358.m_backend.data._M_elems._24_5_;
      local_3b8.data._M_elems[7]._1_3_ = local_358.m_backend.data._M_elems[7]._1_3_;
      local_3b8.data._M_elems[2] = local_358.m_backend.data._M_elems[2];
      local_3b8.data._M_elems[3] = local_358.m_backend.data._M_elems[3];
      local_3b8.exp = local_358.m_backend.exp;
      local_3b8.neg = local_358.m_backend.neg;
      local_3b8.fpclass = local_358.m_backend.fpclass;
      local_3b8.prec_elem = local_358.m_backend.prec_elem;
      iVar4 = (this->u).row.len[lVar26];
      lVar26 = (long)(iVar4 + iVar22);
      lVar21 = (lVar26 << 0x20) + -0x200000000;
      lVar14 = lVar26 * 0x38;
      uVar23 = (iVar4 + iVar22) - 2;
      do {
        uVar16 = uVar23;
        lVar24 = lVar14;
        lVar20 = lVar21;
        pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)(ulong)uVar16;
        if (lVar26 <= lVar17) goto LAB_0021e0f1;
        pnVar6 = (this->u).row.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_148 = *(undefined8 *)((long)(pnVar6->m_backend).data._M_elems + lVar24 + -0x18);
        puVar3 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar24);
        local_168 = *puVar3;
        uStack_160 = puVar3[1];
        puVar3 = (undefined8 *)((long)(&(pnVar6->m_backend).data + 0xffffffffffffffff) + lVar24);
        local_158 = *puVar3;
        uStack_150 = puVar3[1];
        local_140 = *(undefined4 *)((long)(pnVar6->m_backend).data._M_elems + lVar24 + -0x10);
        local_13c = *(undefined1 *)((long)(pnVar6->m_backend).data._M_elems + lVar24 + -0xc);
        local_138 = *(undefined8 *)((long)(pnVar6->m_backend).data._M_elems + lVar24 + -8);
        boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_358,(multiprecision *)&local_168,pnVar18);
        this = local_378;
        tVar11 = boost::multiprecision::operator<
                           ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_3b8,&local_358);
        if (tVar11) {
          pnVar6 = (this->u).row.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_188 = *(undefined8 *)((long)(pnVar6->m_backend).data._M_elems + lVar24 + -0x18);
          puVar3 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar24);
          local_1a8 = *puVar3;
          uStack_1a0 = puVar3[1];
          puVar3 = (undefined8 *)((long)(&(pnVar6->m_backend).data + 0xffffffffffffffff) + lVar24);
          local_198 = *puVar3;
          uStack_190 = puVar3[1];
          local_180 = *(undefined4 *)((long)(pnVar6->m_backend).data._M_elems + lVar24 + -0x10);
          local_17c = *(undefined1 *)((long)(pnVar6->m_backend).data._M_elems + lVar24 + -0xc);
          local_178 = *(undefined8 *)((long)(pnVar6->m_backend).data._M_elems + lVar24 + -8);
          boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&local_358,(multiprecision *)&local_1a8,arg_00);
          local_3b8.data._M_elems._32_5_ = local_358.m_backend.data._M_elems._32_5_;
          local_3b8.data._M_elems[9]._1_3_ = local_358.m_backend.data._M_elems[9]._1_3_;
          local_3b8.data._M_elems[1] = local_358.m_backend.data._M_elems[1];
          local_3b8.data._M_elems[0] = local_358.m_backend.data._M_elems[0];
          local_3b8.data._M_elems[4] = local_358.m_backend.data._M_elems[4];
          local_3b8.data._M_elems[5] = local_358.m_backend.data._M_elems[5];
          local_3b8.data._M_elems._24_5_ = local_358.m_backend.data._M_elems._24_5_;
          local_3b8.data._M_elems[7]._1_3_ = local_358.m_backend.data._M_elems[7]._1_3_;
          local_3b8.data._M_elems[2] = local_358.m_backend.data._M_elems[2];
          local_3b8.data._M_elems[3] = local_358.m_backend.data._M_elems[3];
          local_3b8.exp = local_358.m_backend.exp;
          local_3b8.neg = local_358.m_backend.neg;
          local_3b8.fpclass = local_358.m_backend.fpclass;
          local_3b8.prec_elem = local_358.m_backend.prec_elem;
        }
        lVar1 = lVar26 + -1;
        lVar10 = lVar26 + -1;
        lVar21 = lVar20 + -0x100000000;
        lVar26 = lVar1;
        lVar14 = lVar24 + -0x38;
        uVar23 = uVar16 - 1;
      } while ((this->u).row.idx[lVar10] != local_3c8);
      pnVar6 = (this->u).row.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_318.data._M_elems._32_8_ =
           *(undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar24 + 0x20);
      puVar2 = (uint *)((long)pnVar6[-1].m_backend.data._M_elems + lVar24);
      local_318.data._M_elems._0_8_ = *(undefined8 *)puVar2;
      local_318.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
      puVar2 = (uint *)((long)pnVar6[-1].m_backend.data._M_elems + lVar24 + 0x10);
      local_318.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      local_318.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
      local_318.exp = *(int *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar24);
      local_318.neg = *(bool *)((long)(&pnVar6[-1].m_backend.data + 1) + 4U + lVar24);
      pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)(ulong)CONCAT31((int3)((uint)local_318.exp >> 8),local_318.neg);
      local_318._48_8_ = *(undefined8 *)((long)(&pnVar6[-1].m_backend.data + 1) + 8U + lVar24);
      local_3c0 = (int)lVar1;
LAB_0021e0f1:
      lVar21 = (long)(int)uVar16 * 0x38 + 0x30;
      for (lVar20 = lVar20 >> 0x20; lVar17 < lVar20; lVar20 = lVar20 + -1) {
        pnVar6 = (this->u).row.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_1c8 = *(undefined8 *)((long)(pnVar6->m_backend).data._M_elems + lVar21 + -0x10);
        puVar3 = (undefined8 *)((long)(pnVar6->m_backend).data._M_elems + lVar21 + -0x30);
        local_1e8 = *puVar3;
        uStack_1e0 = puVar3[1];
        puVar3 = (undefined8 *)((long)(pnVar6->m_backend).data._M_elems + lVar21 + -0x20);
        local_1d8 = *puVar3;
        uStack_1d0 = puVar3[1];
        local_1c0 = *(undefined4 *)((long)(pnVar6->m_backend).data._M_elems + lVar21 + -8);
        local_1bc = *(undefined1 *)((long)(pnVar6->m_backend).data._M_elems + lVar21 + -4);
        local_1b8 = *(undefined8 *)((long)(pnVar6->m_backend).data._M_elems + lVar21);
        boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_358,(multiprecision *)&local_1e8,pnVar18);
        tVar11 = boost::multiprecision::operator<
                           ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_3b8,&local_358);
        pnVar18 = arg_01;
        if (tVar11) {
          pnVar6 = (this->u).row.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_208 = *(undefined8 *)((long)(pnVar6->m_backend).data._M_elems + lVar21 + -0x10);
          puVar3 = (undefined8 *)((long)(pnVar6->m_backend).data._M_elems + lVar21 + -0x30);
          local_228 = *puVar3;
          uStack_220 = puVar3[1];
          puVar3 = (undefined8 *)((long)(pnVar6->m_backend).data._M_elems + lVar21 + -0x20);
          local_218 = *puVar3;
          uStack_210 = puVar3[1];
          local_200 = *(undefined4 *)((long)(pnVar6->m_backend).data._M_elems + lVar21 + -8);
          local_1fc = *(undefined1 *)((long)(pnVar6->m_backend).data._M_elems + lVar21 + -4);
          local_1f8 = *(undefined8 *)((long)(pnVar6->m_backend).data._M_elems + lVar21);
          boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&local_358,(multiprecision *)&local_228,arg_01);
          local_3b8.data._M_elems._32_5_ = local_358.m_backend.data._M_elems._32_5_;
          local_3b8.data._M_elems[9]._1_3_ = local_358.m_backend.data._M_elems[9]._1_3_;
          local_3b8.data._M_elems[1] = local_358.m_backend.data._M_elems[1];
          local_3b8.data._M_elems[0] = local_358.m_backend.data._M_elems[0];
          local_3b8.data._M_elems[4] = local_358.m_backend.data._M_elems[4];
          local_3b8.data._M_elems[5] = local_358.m_backend.data._M_elems[5];
          local_3b8.data._M_elems._24_5_ = local_358.m_backend.data._M_elems._24_5_;
          local_3b8.data._M_elems[7]._1_3_ = local_358.m_backend.data._M_elems[7]._1_3_;
          local_3b8.data._M_elems[2] = local_358.m_backend.data._M_elems[2];
          local_3b8.data._M_elems[3] = local_358.m_backend.data._M_elems[3];
          local_3b8.exp = local_358.m_backend.exp;
          local_3b8.neg = local_358.m_backend.neg;
          local_3b8.fpclass = local_358.m_backend.fpclass;
          local_3b8.prec_elem = local_358.m_backend.prec_elem;
          pnVar18 = extraout_RDX_01;
        }
        lVar21 = lVar21 + -0x38;
      }
      pnVar6 = (this->temp).s_max.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(ulong *)((long)(pnVar6->m_backend).data._M_elems + local_2c0 + 0x20) =
           CONCAT35(local_3b8.data._M_elems[9]._1_3_,local_3b8.data._M_elems._32_5_);
      puVar2 = (uint *)((long)(pnVar6->m_backend).data._M_elems + local_2c0 + 0x10);
      *(undefined8 *)puVar2 = local_3b8.data._M_elems._16_8_;
      *(ulong *)(puVar2 + 2) =
           CONCAT35(local_3b8.data._M_elems[7]._1_3_,local_3b8.data._M_elems._24_5_);
      puVar2 = (uint *)((long)(pnVar6->m_backend).data._M_elems + local_2c0);
      *(undefined8 *)puVar2 = local_3b8.data._M_elems._0_8_;
      *(undefined8 *)(puVar2 + 2) = local_3b8.data._M_elems._8_8_;
      *(int *)((long)(&(pnVar6->m_backend).data + 1) + local_2c0) = local_3b8.exp;
      *(bool *)((long)(&(pnVar6->m_backend).data + 1) + 4U + local_2c0) = local_3b8.neg;
      *(undefined8 *)((long)(&(pnVar6->m_backend).data + 1) + 8U + local_2c0) = local_3b8._48_8_;
    }
    uVar19 = local_368;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_3b8,local_2c8)
    ;
    local_268 = (multiprecision  [8])local_318.data._M_elems._0_8_;
    auStack_260[0] = local_318.data._M_elems[2];
    auStack_260[1] = local_318.data._M_elems[3];
    local_258[0] = local_318.data._M_elems[4];
    local_258[1] = local_318.data._M_elems[5];
    auStack_250[0] = local_318.data._M_elems[6];
    auStack_250[1] = local_318.data._M_elems[7];
    local_248[0] = local_318.data._M_elems[8];
    local_248[1] = local_318.data._M_elems[9];
    local_240 = local_318.exp;
    local_23c = local_318.neg;
    local_238 = local_318.fpclass;
    iStack_234 = local_318.prec_elem;
    boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_358,local_268,arg_02);
    tVar11 = boost::multiprecision::operator>
                       (&local_358,
                        (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_3b8);
    lVar17 = local_360;
    lVar21 = local_2d0;
    iVar22 = local_36c;
    if ((tVar11) &&
       (local_3c4 = local_3c0, iVar22 = local_2d8, iVar12 = local_2d4, local_2d8 <= local_2dc)) {
      lVar26 = local_320;
      goto LAB_0021e572;
    }
  }
  lVar17 = lVar17 + -1;
  goto LAB_0021dcf4;
}

Assistant:

void CLUFactor<R>::selectPivots(R threshold)
{
   int ii;
   int i;
   int j;
   int k;
   int ll = -1; // This value should never be used.
   int kk;
   int m;
   int count;
   int num;
   int rw = -1; // This value should never be used.
   int cl = -1; // This value should never be used.
   int len;
   int beg;
   R l_maxabs;
   R x = R(0.0);   // This value should never be used.
   int mkwtz;
   int candidates;

   candidates = thedim - temp.stage - 1;

   if(candidates > 4)
      candidates = 4;

   num = 0;

   count = 2;

   for(;;)
   {
      ii = -1;

      if(temp.pivot_rowNZ[count].next != &(temp.pivot_rowNZ[count]))
      {
         rw = temp.pivot_rowNZ[count].next->idx;
         beg = u.row.start[rw];
         len = u.row.len[rw] + beg - 1;

         /*  set l_maxabs to maximum absolute value in row
          *  (compute it if necessary).
          */

         if((l_maxabs = temp.s_max[rw]) < 0)
         {
            l_maxabs = spxAbs(u.row.val[len]);

            for(i = len - 1; i >= beg; --i)
               if(l_maxabs < spxAbs(u.row.val[i]))
                  l_maxabs = spxAbs(u.row.val[i]);

            temp.s_max[rw] = l_maxabs;               /* ##### */
         }

         l_maxabs *= threshold;

         /*  select pivot element with lowest markowitz number in row
          */
         mkwtz = thedim + 1;

         for(i = len; i >= beg; --i)
         {
            k = u.row.idx[i];
            j = temp.s_cact[k];
            x = u.row.val[i];

            if(j < mkwtz && spxAbs(x) > l_maxabs)
            {
               mkwtz = j;
               cl = k;
               ii = i;

               if(j <= count)               /* ##### */
                  break;
            }
         }
      }
      else if(temp.pivot_colNZ[count].next != &(temp.pivot_colNZ[count]))
      {
         cl = temp.pivot_colNZ[count].next->idx;
         beg = u.col.start[cl];
         len = u.col.len[cl] + beg - 1;
         beg = len - temp.s_cact[cl] + 1;
         assert(count == temp.s_cact[cl]);

         /*  select pivot element with lowest markowitz number in column
          */
         mkwtz = thedim + 1;

         for(i = len; i >= beg; --i)
         {
            k = u.col.idx[i];
            j = u.row.len[k];

            if(j < mkwtz)
            {
               /*  ensure that element (cl,k) is stable.
                */
               if(temp.s_max[k] > 0)
               {
                  /*  case 1: l_maxabs is known
                   */
                  for(m = u.row.start[k], kk = m + u.row.len[k] - 1;
                        kk >= m; --kk)
                  {
                     if(u.row.idx[kk] == cl)
                     {
                        x = u.row.val[kk];
                        ll = kk;
                        break;
                     }
                  }

                  l_maxabs = temp.s_max[k];
               }
               else
               {
                  /*  case 2: l_maxabs needs to be computed
                   */
                  m = u.row.start[k];
                  l_maxabs = spxAbs(u.row.val[m]);

                  for(kk = m + u.row.len[k] - 1; kk >= m; --kk)
                  {
                     if(l_maxabs < spxAbs(u.row.val[kk]))
                        l_maxabs = spxAbs(u.row.val[kk]);

                     if(u.row.idx[kk] == cl)
                     {
                        x = u.row.val[kk];
                        ll = kk;
                        break;
                     }
                  }

                  for(--kk; kk > m; --kk)
                  {
                     if(l_maxabs < spxAbs(u.row.val[kk]))
                        l_maxabs = spxAbs(u.row.val[kk]);
                  }

                  temp.s_max[k] = l_maxabs;
               }

               l_maxabs *= threshold;

               if(spxAbs(x) > l_maxabs)
               {
                  mkwtz = j;
                  rw = k;
                  ii = ll;

                  if(j <= count + 1)
                     break;
               }
            }
         }
      }
      else
      {
         ++count;
         continue;
      }

      assert(cl >= 0);

      removeDR(temp.pivot_col[cl]);
      initDR(temp.pivot_col[cl]);

      if(ii >= 0)
      {
         /*  Initialize selected pivot element
          */
         CLUFactor<R>::Pring* pr;
         temp.pivot_row[rw].pos = ii - u.row.start[rw];
         temp.pivot_row[rw].mkwtz = mkwtz = (mkwtz - 1) * (count - 1);
         // ??? mkwtz originally was long,
         // maybe to avoid an overflow in this instruction?

         for(pr = temp.pivots.next; pr->idx >= 0; pr = pr->next)
         {
            if(pr->idx == rw || pr->mkwtz >= mkwtz)
               break;
         }

         pr = pr->prev;

         if(pr->idx != rw)
         {
            removeDR(temp.pivot_row[rw]);
            init2DR(temp.pivot_row[rw], *pr);
         }

         num++;

         if(num >= candidates)
            break;
      }
   }

   /*
    *     while(temp.temp.next->mkwtz < temp.temp.prev->mkwtz)
    *     {
    *     Pring   *pr;
    *     pr = temp.temp.prev;
    *     removeDR(*pr);
    *     init2DR (*pr, rowNZ[u.row.len[pr->idx]]);
    }
    */

   assert(row.perm[rw] < 0);

   assert(col.perm[cl] < 0);
}